

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintEnum
          (string *__return_storage_ptr__,FieldValuePrinter *this,int32 val,string *name)

{
  StringBaseTextGenerator generator;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_30 = 0;
  local_28[0] = 0;
  local_38 = local_28;
  std::__cxx11::string::append((char *)&local_38,(ulong)(name->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_38,local_38 + local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintEnum(
    int32 val, const std::string& name) const {
  FORWARD_IMPL(PrintEnum, val, name);
}